

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int available_hreg_p(int hreg,MIR_reg_t type,int nregs,bitmap_t *conflict_locs,
                    live_range_t_conflict lr)

{
  int iVar1;
  int iVar2;
  undefined4 in_register_00000014;
  long lVar3;
  
  for (lVar3 = (long)*(int *)(conflict_locs + 1); iVar1 = *(int *)((long)conflict_locs + 0xc),
      lVar3 <= iVar1; lVar3 = lVar3 + 1) {
    iVar2 = bitmap_bit_p(*(const_bitmap_t *)(CONCAT44(in_register_00000014,nregs) + lVar3 * 8),
                         (long)hreg);
    if (iVar2 != 0) break;
    if (1 < (int)type) {
      if (0x21 < hreg + 1U) break;
      iVar2 = bitmap_bit_p(*(const_bitmap_t *)(CONCAT44(in_register_00000014,nregs) + lVar3 * 8),
                           (ulong)(hreg + 1U));
      if (iVar2 != 0) break;
    }
  }
  return (int)(iVar1 < lVar3);
}

Assistant:

static int available_hreg_p (int hreg, MIR_reg_t type, int nregs, bitmap_t *conflict_locs,
                             live_range_t lr) {
  for (int j = lr->start; j <= lr->finish; j++) {
    if (bitmap_bit_p (conflict_locs[j], hreg)) return FALSE;
    if (nregs > 1) {
      if (target_nth_loc (hreg, type, nregs - 1) > MAX_HARD_REG) return FALSE;
      for (int k = nregs - 1; k > 0; k--) {
        MIR_reg_t curr_hreg = target_nth_loc (hreg, type, k);
        if (bitmap_bit_p (conflict_locs[j], curr_hreg)) return FALSE;
      }
    }
  }
  return TRUE;
}